

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O3

unsigned_long __thiscall
CVmObjStrComp::match_strings
          (CVmObjStrComp *this,char *valstr,size_t vallen,char *refstr,size_t reflen)

{
  long *plVar1;
  size_t *psVar2;
  wchar_t ch;
  wchar_t wVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  wchar_t *pwVar7;
  ulong uVar8;
  size_t sVar9;
  byte *pbVar10;
  ulong uVar11;
  unsigned_long uVar12;
  bool bVar13;
  size_t vlen;
  wchar_t *vp;
  utf8_ptr local_68;
  byte *local_60;
  utf8_ptr local_58;
  byte *local_50;
  int local_44;
  size_t local_40;
  wchar_t *local_38;
  
  plVar1 = (long *)(this->super_CVmObject).ext_;
  local_44 = (int)plVar1[1];
  bVar13 = vallen != 0;
  uVar11 = 0;
  local_68.p_ = valstr;
  local_60 = (byte *)vallen;
  local_58.p_ = refstr;
  local_50 = (byte *)reflen;
  if (reflen != 0 && bVar13) {
    do {
      while( true ) {
        ch = utf8_ptr::s_getch(local_68.p_);
        wVar3 = utf8_ptr::s_getch(local_58.p_);
        if (wVar3 == ch) break;
        if ((local_44 == 0) &&
           (iVar4 = t3_compare_case_fold_min
                              (&local_68,(size_t *)&local_60,&local_58,(size_t *)&local_50),
           iVar4 == 0)) {
          uVar11 = uVar11 | 2;
        }
        else {
          if (plVar1[(ulong)((uint)wVar3 >> 8 & 0xff) + 2] == 0) {
            return 0;
          }
          psVar2 = *(size_t **)
                    (plVar1[(ulong)((uint)wVar3 >> 8 & 0xff) + 2] + (ulong)(uint)(wVar3 & 0xff) * 8)
          ;
          if (psVar2 == (size_t *)0x0) {
            return 0;
          }
          uVar5 = t3_get_chartype(ch);
          uVar11 = uVar11 | psVar2[(ulong)((uVar5 & 0xfffffffe) != 2) + 2];
          local_38 = (wchar_t *)psVar2[1];
          local_40 = *psVar2;
          bVar13 = local_40 != 0;
          if ((local_60 != (byte *)0x0) && (local_40 != 0)) {
            uVar8 = uVar11 | 2;
            do {
              while( true ) {
                sVar9 = local_40 - 1;
                pwVar7 = local_38 + 1;
                if (*local_38 != ch) break;
                pbVar6 = (byte *)(local_68.p_ +
                                 (ulong)((((byte)*local_68.p_ >> 5 & 1) != 0) + 1 &
                                        (uint)((byte)*local_68.p_ >> 7) * 3) + 1);
                bVar13 = sVar9 != 0;
                local_60 = (byte *)(local_68.p_ + ((long)local_60 - (long)pbVar6));
                local_68.p_ = (char *)pbVar6;
                local_40 = sVar9;
                local_38 = pwVar7;
                if ((local_60 == (byte *)0x0) || (!bVar13)) goto LAB_00280e38;
              }
              if ((local_44 != 0) ||
                 (iVar4 = t3_compare_case_fold_min
                                    (&local_68,(size_t *)&local_60,&local_38,&local_40), iVar4 != 0)
                 ) goto LAB_00280ea0;
              bVar13 = local_40 != 0;
              uVar11 = uVar8;
            } while ((local_60 != (byte *)0x0) && (local_40 != 0));
          }
LAB_00280e38:
          if (bVar13) goto LAB_00280ea0;
          local_50 = (byte *)(local_58.p_ +
                             ((long)local_50 -
                             (long)(local_58.p_ +
                                   (ulong)((((byte)*local_58.p_ >> 5 & 1) != 0) + 1 &
                                          (uint)((byte)*local_58.p_ >> 7) * 3) + 1)));
          local_58.p_ = local_58.p_ +
                        (ulong)((((byte)*local_58.p_ >> 5 & 1) != 0) + 1 &
                               (uint)((byte)*local_58.p_ >> 7) * 3) + 1;
        }
        bVar13 = local_60 != (byte *)0x0;
        vallen = (size_t)local_60;
        reflen = (size_t)local_50;
        if ((local_60 == (byte *)0x0) || (local_50 == (byte *)0x0)) goto LAB_00280e97;
      }
      pbVar10 = (byte *)(local_68.p_ +
                        (ulong)((((byte)*local_68.p_ >> 5 & 1) != 0) + 1 &
                               (uint)((byte)*local_68.p_ >> 7) * 3) + 1);
      pbVar6 = (byte *)(local_68.p_ + ((long)local_60 - (long)pbVar10));
      reflen = (size_t)(local_58.p_ +
                       ((long)local_50 -
                       (long)(local_58.p_ +
                             (ulong)((((byte)*local_58.p_ >> 5 & 1) != 0) + 1 &
                                    (uint)((byte)*local_58.p_ >> 7) * 3) + 1)));
      vallen = (size_t)(local_68.p_ + ((long)local_60 - (long)pbVar10));
      bVar13 = (byte *)vallen != (byte *)0x0;
      local_68.p_ = (char *)pbVar10;
    } while ((bVar13) &&
            (local_60 = pbVar6,
            local_58.p_ = local_58.p_ +
                          (ulong)((((byte)*local_58.p_ >> 5 & 1) != 0) + 1 &
                                 (uint)((byte)*local_58.p_ >> 7) * 3) + 1, local_50 = (byte *)reflen
            , (byte *)reflen != (byte *)0x0));
  }
LAB_00280e97:
  if ((byte *)vallen == (byte *)0x0 && (byte *)reflen == (byte *)0x0) {
    uVar12 = uVar11 | 1;
  }
  else if (bVar13) {
LAB_00280ea0:
    uVar12 = 0;
  }
  else {
    uVar8 = 0;
    if (local_68.p_ != valstr && -1 < (long)local_68.p_ - (long)valstr) {
      do {
        valstr = (char *)((byte *)valstr +
                         (ulong)((((byte)*valstr >> 5 & 1) != 0) + 1 &
                                (uint)((byte)*valstr >> 7) * 3) + 1);
        uVar8 = uVar8 + 1;
      } while (valstr < local_68.p_);
    }
    uVar12 = 0;
    if (*plVar1 - 1U < uVar8) {
      uVar12 = uVar11 | 5;
    }
  }
  return uVar12;
}

Assistant:

unsigned long CVmObjStrComp::match_strings(const char *valstr, size_t vallen,
                                           const char *refstr, size_t reflen)
{
    vmobj_strcmp_ext *ext = get_ext();
    utf8_ptr valp;
    utf8_ptr refp;
    unsigned long ret;
    int fold_case = !(ext->case_sensitive);

    /* set up to scan the strings */
    valp.set((char *)valstr);
    refp.set((char *)refstr);

    /* start with no return flags */
    ret = 0;

    /* scan the strings */
    while (vallen != 0 && reflen != 0)
    {
        /* get each character */
        wchar_t valch = valp.getch();
        wchar_t refch = refp.getch();

        /* check for an exact match first */
        if (refch == valch)
        {
            /* it's an exact match - skip this character in each string */
            valp.inc(&vallen);
            refp.inc(&reflen);
            continue;
        }

        /* check for a case-folded match if we're insensitive to case */
        if (fold_case
            && t3_compare_case_fold_min(valp, vallen, refp, reflen) == 0)
        {
            /* note in the flags that we have differing cases in the match */
            ret |= RF_CASEFOLD;

            /* keep going */
            continue;
        }

        /* check for a reference equivalence mapping */
        vmobj_strcmp_equiv **t1;
        vmobj_strcmp_equiv *eq;
        if ((t1 = ext->equiv[(refch >> 8) & 0xFF]) != 0
            && (eq = t1[refch & 0xFF]) != 0)
        {
            /* 
             *   In case we match, apply the appropriate flags added for the
             *   equivalence mapping, based on the case of the first value
             *   character we're testing.  (If we don't match, we'll simply
             *   return failure, so it won't matter that we messed with the
             *   flags.)  
             */
            ret |= (t3_is_upper(valch)
                    ? eq->uc_result_flags
                    : eq->lc_result_flags);

            /* match each character from the mapping string */
            const wchar_t *vp;
            size_t vlen;
            for (vp = eq->val_ch, vlen = eq->val_ch_cnt ;
                 vallen != 0 && vlen != 0 ; )
            {
                /* get this character */
                refch = *vp;
                
                /* if we have an exact match, keep going */
                if (refch == valch)
                {
                    /* matched - skip this character in each string */
                    valp.inc(&vallen);
                    ++vp, --vlen;

                    /* keep going */
                    continue;
                }

                /* check for a case-folded match if appropriate */
                if (fold_case
                    && t3_compare_case_fold_min(valp, vallen, vp, vlen) == 0)
                {
                    /* note the case-folded match and keep going */
                    ret |= RF_CASEFOLD;
                    continue;
                }

                /* no match */
                return 0;
            }

            /* 
             *   if we didn't make it to the end of the equivalence string,
             *   we must have run out of source before we matched the whole
             *   string, so we don'to have a match 
             */
            if (vlen != 0)
                return 0;

            /* 
             *   If we make it here, we matched the equivalence mapping.
             *   We've already skipped the input we matched, so skip the
             *   reference character and keep going.  
             */
            refp.inc(&reflen);
            continue;
        }

        /* we don't have anything else to try, so we don't have a match */
        return 0;
    }

    /* 
     *   If we ran out of reference string before we ran out of value
     *   string, we definitely do not have a match.  If we ran out of value
     *   string before we ran out reference string, we have a match as long
     *   as we matched at least the truncation length. 
     */
    if (reflen == 0 && vallen == 0)
    {
        /* 
         *   We ran out of both at the same time - it's a match.  Return the
         *   result code up to this point OR'd with RF_MATCH, which is our
         *   pre-defined bit that we set for every match.  
         */
        return (ret | RF_MATCH);
    }
    else if (vallen != 0)
    {
        /* we ran out of reference string first - it's not a match */
        return 0;
    }
    else
    {
        /* 
         *   We ran out of value string first, so it's a truncated match if
         *   we matched at least up to the truncation length (assuming we
         *   allow truncation at all).  If we didn't make it to the
         *   truncation length, or we don't allow truncation, it's not a
         *   match. 
         */
        size_t valcharlen = utf8_ptr::s_len(valstr, valp.getptr() - valstr);
        if (ext->trunc_len != 0 && valcharlen >= ext->trunc_len)
        {
            /* 
             *   it's a truncated match - return the result code up to this
             *   point, OR'd with RF_MATCH (our pre-defined bit we set for
             *   every match) and RF_TRUNC (our pre-defined bit we set for
             *   truncated matches) 
             */
            return (ret | RF_MATCH | RF_TRUNC);
        }
        else
        {
            /* didn't make it to the truncation length, so it's not a match */
            return 0;
        }
    }
}